

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O0

prsndef * prsnew4(prscxdef *ctx,int t,prsndef *n1,prsndef *n2,prsndef *n3,prsndef *n4)

{
  prsndef *ppVar1;
  long in_RCX;
  prsndef *in_RDX;
  int in_ESI;
  prsndef *in_R8;
  prscxdef *in_R9;
  prsndef *n;
  undefined8 in_stack_ffffffffffffffc8;
  
  ppVar1 = prsalo(in_R9,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  ppVar1->prsntyp = in_ESI;
  ppVar1->prsnnlf = 4;
  (ppVar1->prsnv).prsnvn[0] = in_RDX;
  (ppVar1->prsnv).prsnvt.tokval = in_RCX;
  (ppVar1->prsnv).prsnvn[2] = in_R8;
  (ppVar1->prsnv).prsnvn[3] = (prsndef *)in_R9;
  return ppVar1;
}

Assistant:

prsndef *prsnew4(prscxdef *ctx, int t, prsndef *n1, prsndef *n2,
                 prsndef *n3, prsndef *n4)
{
    prsndef *n = prsalo(ctx, 4);
    
    n->prsntyp = t;
    n->prsnnlf = 4;
    n->prsnv.prsnvn[0] = n1;
    n->prsnv.prsnvn[1] = n2;
    n->prsnv.prsnvn[2] = n3;
    n->prsnv.prsnvn[3] = n4;
    return(n);
}